

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

int lua_resume(lua_State *L,lua_State *from,int nargs,int *nresults)

{
  CallInfo **ppCVar1;
  ushort uVar2;
  uint uVar3;
  CallInfo *pCVar4;
  byte errcode;
  uint uVar5;
  anon_union_4_3_18ab96e6_for_u2 aVar6;
  StkId pSVar7;
  CallInfo **ppCVar8;
  char *msg;
  int nargs_local;
  
  nargs_local = nargs;
  if (L->status == '\x01') {
LAB_0010b2f8:
    if (from == (lua_State *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar2 = (ushort)from->nCcalls;
      uVar5 = (uint)uVar2;
      L->nCcalls = (uint)uVar2;
      if (199 < uVar2) {
        msg = "C stack overflow";
        goto LAB_0010b319;
      }
    }
    L->nCcalls = uVar5 + 1;
    errcode = luaD_rawrunprotected(L,resume,&nargs_local);
    ppCVar1 = &L->ci;
    while (uVar5 = (uint)errcode, ppCVar8 = ppCVar1, 1 < errcode) {
      while( true ) {
        pCVar4 = *ppCVar8;
        if (pCVar4 == (CallInfo *)0x0) {
          L->status = errcode;
          luaD_seterrorobj(L,errcode,(L->top).p);
          pSVar7 = (L->top).p;
          (L->ci->top).p = pSVar7;
          goto LAB_0010b3b6;
        }
        uVar3 = pCVar4->callstatus;
        if ((uVar3 >> 0x15 & 1) != 0) break;
        ppCVar8 = &pCVar4->previous;
      }
      L->ci = pCVar4;
      pCVar4->callstatus = (uint)errcode << 0xc | uVar3 & 0xffff8fff;
      errcode = luaD_rawrunprotected(L,unroll,(void *)0x0);
    }
    if (errcode == 1) {
      aVar6 = (*ppCVar1)->u2;
    }
    else {
      pSVar7 = (L->top).p;
LAB_0010b3b6:
      aVar6.funcidx = (int)((ulong)((long)pSVar7 + (-0x10 - ((*ppCVar1)->func).offset)) >> 4);
    }
    *nresults = (int)aVar6;
  }
  else {
    if (L->status == '\0') {
      if (L->ci != &L->base_ci) {
        msg = "cannot resume non-suspended coroutine";
        goto LAB_0010b319;
      }
      if ((long)(L->top).p + (-0x10 - (L->ci->func).offset) >> 4 != (long)nargs) goto LAB_0010b2f8;
    }
    msg = "cannot resume dead coroutine";
LAB_0010b319:
    resume_error(L,msg,nargs);
    uVar5 = 2;
  }
  return uVar5;
}

Assistant:

LUA_API int lua_resume (lua_State *L, lua_State *from, int nargs,
                                      int *nresults) {
  TStatus status;
  lua_lock(L);
  if (L->status == LUA_OK) {  /* may be starting a coroutine */
    if (L->ci != &L->base_ci)  /* not in base level? */
      return resume_error(L, "cannot resume non-suspended coroutine", nargs);
    else if (L->top.p - (L->ci->func.p + 1) == nargs)  /* no function? */
      return resume_error(L, "cannot resume dead coroutine", nargs);
  }
  else if (L->status != LUA_YIELD)  /* ended with errors? */
    return resume_error(L, "cannot resume dead coroutine", nargs);
  L->nCcalls = (from) ? getCcalls(from) : 0;
  if (getCcalls(L) >= LUAI_MAXCCALLS)
    return resume_error(L, "C stack overflow", nargs);
  L->nCcalls++;
  luai_userstateresume(L, nargs);
  api_checkpop(L, (L->status == LUA_OK) ? nargs + 1 : nargs);
  status = luaD_rawrunprotected(L, resume, &nargs);
   /* continue running after recoverable errors */
  status = precover(L, status);
  if (l_likely(!errorstatus(status)))
    lua_assert(status == L->status);  /* normal end or yield */
  else {  /* unrecoverable error */
    L->status = status;  /* mark thread as 'dead' */
    luaD_seterrorobj(L, status, L->top.p);  /* push error message */
    L->ci->top.p = L->top.p;
  }
  *nresults = (status == LUA_YIELD) ? L->ci->u2.nyield
                                    : cast_int(L->top.p - (L->ci->func.p + 1));
  lua_unlock(L);
  return APIstatus(status);
}